

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::storage_base::foreign_keys(storage_base *this,sqlite3 *db,bool value)

{
  int iVar1;
  uint uVar2;
  system_error *this_00;
  error_category *peVar3;
  char *__what;
  error_code __ec;
  __string_type query;
  stringstream ss;
  long *local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"PRAGMA foreign_keys = ",0x16);
  std::ostream::_M_insert<bool>(SUB81((ostream *)local_198,0));
  std::__cxx11::stringbuf::str();
  iVar1 = sqlite3_exec(db,local_1c8,0,0,0);
  if (iVar1 == 0) {
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  uVar2 = sqlite3_errcode(db);
  peVar3 = &get_sqlite_error_category()->super_error_category;
  __what = (char *)sqlite3_errmsg(db);
  __ec._4_4_ = 0;
  __ec._M_value = uVar2;
  __ec._M_cat = peVar3;
  std::system_error::system_error(this_00,__ec,__what);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void foreign_keys(sqlite3 *db, bool value) {
        std::stringstream ss;
        ss << "PRAGMA foreign_keys = " << value;
        auto query = ss.str();
        auto rc = sqlite3_exec(db, query.c_str(), nullptr, nullptr, nullptr);
        if(rc != SQLITE_OK) {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }